

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__encode_first_scanline_from_scatter
               (stbir__info *stbir_info,stbir__per_split_info *split_info)

{
  int iVar1;
  float *encode_buffer;
  int iVar2;
  
  encode_buffer =
       stbir__get_ring_buffer_entry(stbir_info,split_info,split_info->ring_buffer_begin_index);
  stbir__encode_scanline
            (stbir_info,
             (void *)((long)stbir_info->output_stride_bytes *
                      (long)split_info->ring_buffer_first_scanline + (long)stbir_info->output_data),
             encode_buffer,split_info->ring_buffer_first_scanline);
  *encode_buffer = 3e+38;
  split_info->ring_buffer_first_scanline = split_info->ring_buffer_first_scanline + 1;
  iVar1 = split_info->ring_buffer_begin_index + 1;
  iVar2 = 0;
  if (iVar1 != stbir_info->ring_buffer_num_entries) {
    iVar2 = iVar1;
  }
  split_info->ring_buffer_begin_index = iVar2;
  return;
}

Assistant:

static void stbir__encode_first_scanline_from_scatter(stbir__info const * stbir_info, stbir__per_split_info* split_info)
{
  // evict a scanline out into the output buffer
  float* ring_buffer_entry = stbir__get_ring_buffer_entry(stbir_info, split_info, split_info->ring_buffer_begin_index );

  // dump the scanline out
  stbir__encode_scanline( stbir_info, ( (char *)stbir_info->output_data ) + ( (size_t)split_info->ring_buffer_first_scanline * (size_t)stbir_info->output_stride_bytes ), ring_buffer_entry, split_info->ring_buffer_first_scanline  STBIR_ONLY_PROFILE_SET_SPLIT_INFO );

  // mark it as empty
  ring_buffer_entry[ 0 ] = STBIR__FLOAT_EMPTY_MARKER;

  // advance the first scanline
  split_info->ring_buffer_first_scanline++;
  if ( ++split_info->ring_buffer_begin_index == stbir_info->ring_buffer_num_entries )
    split_info->ring_buffer_begin_index = 0;
}